

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_value.cpp
# Opt level: O3

Am_Value * __thiscall Am_Value::operator=(Am_Value *this,Am_Value *in_value)

{
  uint *puVar1;
  Am_Value_Type AVar2;
  Am_Wrapper *pAVar3;
  
  if (((short)this->type < 0) && (pAVar3 = (this->value).wrapper_value, pAVar3 != (Am_Wrapper *)0x0)
     ) {
    puVar1 = &pAVar3->refs;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      (*(pAVar3->super_Am_Registered_Type)._vptr_Am_Registered_Type[4])();
    }
  }
  AVar2 = in_value->type;
  this->type = AVar2;
  pAVar3 = (in_value->value).wrapper_value;
  (this->value).wrapper_value = pAVar3;
  if (pAVar3 != (Am_Wrapper *)0x0 && (short)AVar2 < 0) {
    pAVar3->refs = pAVar3->refs + 1;
  }
  return this;
}

Assistant:

Am_Value &
Am_Value::operator=(const Am_Value &in_value)
{
  if (Am_Type_Is_Ref_Counted(type) && value.wrapper_value)
    value.wrapper_value->Release();
  type = in_value.type;
  value = in_value.value;
  if (Am_Type_Is_Ref_Counted(type) && value.wrapper_value)
    value.wrapper_value->Note_Reference();
  return *this;
}